

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<unsigned_int> **objToLoad,int initSize,bool toCallDestructor,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  ValueVectorOf<unsigned_int> *this;
  XMLSize_t maxElems;
  uint local_44;
  ulong uStack_40;
  uint data;
  XMLSize_t i;
  XMLSize_t vectorSize;
  XSerializeEngine *local_20;
  XSerializeEngine *serEng_local;
  bool toCallDestructor_local;
  ValueVectorOf<unsigned_int> **ppVStack_10;
  int initSize_local;
  ValueVectorOf<unsigned_int> **objToLoad_local;
  
  local_20 = serEng;
  serEng_local._3_1_ = toCallDestructor;
  serEng_local._4_4_ = initSize;
  ppVStack_10 = objToLoad;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    if (*ppVStack_10 == (ValueVectorOf<unsigned_int> *)0x0) {
      if (serEng_local._4_4_ < 0) {
        serEng_local._4_4_ = 0x10;
      }
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      this = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,pMVar2);
      maxElems = (XMLSize_t)serEng_local._4_4_;
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      ValueVectorOf<unsigned_int>::ValueVectorOf
                (this,maxElems,pMVar2,(bool)(serEng_local._3_1_ & 1));
      *ppVStack_10 = this;
    }
    XSerializeEngine::registerObject(local_20,*ppVStack_10);
    i = 0;
    XSerializeEngine::readSize(local_20,&i);
    for (uStack_40 = 0; uStack_40 < i; uStack_40 = uStack_40 + 1) {
      XSerializeEngine::operator>>(local_20,&local_44);
      ValueVectorOf<unsigned_int>::addElement(*ppVStack_10,&local_44);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<unsigned int>**       objToLoad
                                   , int                                 initSize
                                   , bool                                toCallDestructor
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<unsigned int>(
                                                         initSize
                                                       , serEng.getMemoryManager()
                                                       , toCallDestructor
                                                       );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            unsigned int data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}